

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Convolution3DLayerParams::InternalSwap
          (Convolution3DLayerParams *this,Convolution3DLayerParams *other)

{
  Convolution3DLayerParams *other_local;
  Convolution3DLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->outputshape_,&other->outputshape_);
  std::swap<CoreML::Specification::WeightParams*>(&this->weights_,&other->weights_);
  std::swap<CoreML::Specification::WeightParams*>(&this->bias_,&other->bias_);
  std::swap<int>(&this->outputchannels_,&other->outputchannels_);
  std::swap<int>(&this->inputchannels_,&other->inputchannels_);
  std::swap<int>(&this->ngroups_,&other->ngroups_);
  std::swap<int>(&this->kerneldepth_,&other->kerneldepth_);
  std::swap<int>(&this->kernelheight_,&other->kernelheight_);
  std::swap<int>(&this->kernelwidth_,&other->kernelwidth_);
  std::swap<int>(&this->stridedepth_,&other->stridedepth_);
  std::swap<int>(&this->strideheight_,&other->strideheight_);
  std::swap<int>(&this->stridewidth_,&other->stridewidth_);
  std::swap<int>(&this->dilationdepth_,&other->dilationdepth_);
  std::swap<int>(&this->dilationheight_,&other->dilationheight_);
  std::swap<int>(&this->dilationwidth_,&other->dilationwidth_);
  std::swap<bool>(&this->hasbias_,&other->hasbias_);
  std::swap<bool>(&this->isdeconvolution_,&other->isdeconvolution_);
  std::swap<int>(&this->paddingtype_,&other->paddingtype_);
  std::swap<int>(&this->custompaddingfront_,&other->custompaddingfront_);
  std::swap<int>(&this->custompaddingback_,&other->custompaddingback_);
  std::swap<int>(&this->custompaddingtop_,&other->custompaddingtop_);
  std::swap<int>(&this->custompaddingbottom_,&other->custompaddingbottom_);
  std::swap<int>(&this->custompaddingleft_,&other->custompaddingleft_);
  std::swap<int>(&this->custompaddingright_,&other->custompaddingright_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void Convolution3DLayerParams::InternalSwap(Convolution3DLayerParams* other) {
  outputshape_.InternalSwap(&other->outputshape_);
  std::swap(weights_, other->weights_);
  std::swap(bias_, other->bias_);
  std::swap(outputchannels_, other->outputchannels_);
  std::swap(inputchannels_, other->inputchannels_);
  std::swap(ngroups_, other->ngroups_);
  std::swap(kerneldepth_, other->kerneldepth_);
  std::swap(kernelheight_, other->kernelheight_);
  std::swap(kernelwidth_, other->kernelwidth_);
  std::swap(stridedepth_, other->stridedepth_);
  std::swap(strideheight_, other->strideheight_);
  std::swap(stridewidth_, other->stridewidth_);
  std::swap(dilationdepth_, other->dilationdepth_);
  std::swap(dilationheight_, other->dilationheight_);
  std::swap(dilationwidth_, other->dilationwidth_);
  std::swap(hasbias_, other->hasbias_);
  std::swap(isdeconvolution_, other->isdeconvolution_);
  std::swap(paddingtype_, other->paddingtype_);
  std::swap(custompaddingfront_, other->custompaddingfront_);
  std::swap(custompaddingback_, other->custompaddingback_);
  std::swap(custompaddingtop_, other->custompaddingtop_);
  std::swap(custompaddingbottom_, other->custompaddingbottom_);
  std::swap(custompaddingleft_, other->custompaddingleft_);
  std::swap(custompaddingright_, other->custompaddingright_);
  std::swap(_cached_size_, other->_cached_size_);
}